

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::FilterHelper<unsigned_int>
              (JavascriptArray *pArr,RecyclableObject *obj,uint length,Arguments *args,
              ScriptContext *scriptContext)

{
  bool bVar1;
  ThreadContext *threadContext;
  Var pvVar2;
  JavascriptLibrary *pJVar3;
  JavascriptArray *local_88;
  JavascriptArray *newArr;
  RecyclableObject *newObj;
  RecyclableObject *pRStack_70;
  bool isBuiltinArrayCtor;
  Var thisArg;
  RecyclableObject *callBackFn;
  undefined1 local_50 [8];
  JsReentLock jsReentLock;
  ScriptContext *scriptContext_local;
  Arguments *args_local;
  uint length_local;
  RecyclableObject *obj_local;
  JavascriptArray *pArr_local;
  
  jsReentLock._24_8_ = scriptContext;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_50,threadContext);
  JsReentLock::setObjectForMutation((JsReentLock *)local_50,pArr);
  if (1 < (SUB84(args->Info,0) & 0xffffff)) {
    pvVar2 = Arguments::operator[](args,1);
    bVar1 = JavascriptConversion::IsCallable(pvVar2);
    if (bVar1) {
      pvVar2 = Arguments::operator[](args,1);
      thisArg = VarTo<Js::RecyclableObject>(pvVar2);
      pRStack_70 = (RecyclableObject *)0x0;
      if ((SUB84(args->Info,0) & 0xffffff) < 3) {
        pJVar3 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
        pRStack_70 = JavascriptLibraryBase::GetUndefined(&pJVar3->super_JavascriptLibraryBase);
      }
      else {
        pRStack_70 = (RecyclableObject *)Arguments::operator[](args,2);
      }
      newObj._7_1_ = 1;
      JsReentLock::unlock((JsReentLock *)local_50);
      newArr = (JavascriptArray *)
               ArraySpeciesCreate<int>
                         (obj,0,(ScriptContext *)jsReentLock._24_8_,(bool *)0x0,(bool *)0x0,
                          (bool *)((long)&newObj + 7));
      JsReentLock::relock((JsReentLock *)local_50);
      if (newArr == (JavascriptArray *)0x0) {
        pJVar3 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
        local_88 = JavascriptLibrary::CreateArray(pJVar3,0);
        EnsureHead<void*>(local_88);
        newArr = local_88;
      }
      else {
        local_88 = TryVarToNonES5Array(newArr);
        if (local_88 != (JavascriptArray *)0x0) {
          JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(local_88);
          JsReentLock::setSecondObjectForMutation((JsReentLock *)local_50,local_88);
        }
      }
      JsReentLock::unlock((JsReentLock *)local_50);
      pvVar2 = FilterObjectHelper<unsigned_int>
                         (obj,length,0,local_88,(RecyclableObject *)newArr,0,
                          (RecyclableObject *)thisArg,pRStack_70,(ScriptContext *)jsReentLock._24_8_
                         );
      JsReentLock::~JsReentLock((JsReentLock *)local_50);
      return pvVar2;
    }
  }
  JavascriptError::ThrowTypeError
            ((ScriptContext *)jsReentLock._24_8_,-0x7ff5ec34,L"Array.prototype.filter");
}

Assistant:

Var JavascriptArray::FilterHelper(JavascriptArray* pArr, RecyclableObject* obj, T length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Array.prototype.filter"));
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var thisArg = nullptr;

        if (args.Info.Count > 2)
        {
            thisArg = args[2];
        }
        else
        {
            thisArg = scriptContext->GetLibrary()->GetUndefined();
        }

        // If the source object is an Array exotic object we should try to load the constructor property and use it to construct the return object.
        bool isBuiltinArrayCtor = true;
        JS_REENTRANT_NO_MUTATE(jsReentLock, RecyclableObject* newObj = ArraySpeciesCreate(obj, 0, scriptContext, nullptr, nullptr, &isBuiltinArrayCtor));
        JavascriptArray* newArr = nullptr;

        if (newObj == nullptr)
        {
            newArr = scriptContext->GetLibrary()->CreateArray(0);
            newArr->EnsureHead<Var>();
            newObj = newArr;
        }
        else
        {
            // If the new object we created is an array, remember that as it will save us time setting properties in the object below
            newArr = JavascriptArray::TryVarToNonES5Array(newObj);
            if (newArr)
            {
#if ENABLE_COPYONACCESS_ARRAY
                JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(newArr);
#endif
                SET_SECOND_OBJECT_FOR_MUTATION(jsReentLock, newArr);
            }
        }

        JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::FilterObjectHelper<T>(obj, length, 0u, newArr, newObj, 0u, callBackFn, thisArg, scriptContext));
    }